

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnn2table.cpp
# Opt level: O2

int __thiscall QuantizeData::initial_blob_max(QuantizeData *this,Mat *data)

{
  void *pvVar1;
  int i;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  int _c;
  float fVar6;
  float fVar7;
  Mat local_70;
  
  uVar4 = data->h * data->w;
  uVar2 = 0;
  uVar5 = (ulong)uVar4;
  if ((int)uVar4 < 1) {
    uVar5 = uVar2;
  }
  iVar3 = data->c;
  if (data->c < 1) {
    iVar3 = 0;
  }
  while (_c = (int)uVar2, _c != iVar3) {
    ncnn::Mat::channel(&local_70,data,_c);
    pvVar1 = local_70.data;
    ncnn::Mat::~Mat(&local_70);
    fVar6 = this->max_value;
    for (uVar2 = 0; uVar5 != uVar2; uVar2 = uVar2 + 1) {
      fVar7 = ABS(*(float *)((long)pvVar1 + uVar2 * 4));
      if (fVar7 <= fVar6) {
        fVar7 = fVar6;
      }
      fVar6 = fVar7;
      this->max_value = fVar6;
    }
    uVar2 = (ulong)(_c + 1);
  }
  return 0;
}

Assistant:

int QuantizeData::initial_blob_max(ncnn::Mat data)
{
    int channel_num = data.c;
    int size = data.w * data.h;

    for (int q=0; q<channel_num; q++)
    {
        const float *data_n = data.channel(q);
        for(int i=0; i<size; i++)
        {
            max_value = std::max(max_value, std::fabs(data_n[i]));
        }
    }

    return 0;
}